

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int i_3;
  int iVar1;
  int iVar2;
  randomx_flags rVar3;
  undefined4 extraout_var;
  long lVar4;
  size_t sVar5;
  ostream *poVar6;
  randomx_argon2_impl *prVar7;
  unsigned_long uVar8;
  double dVar9;
  runtime_error *prVar10;
  undefined8 *puVar11;
  uint uVar12;
  long in_RCX;
  char *pcVar13;
  pointer ptVar14;
  ulong uVar15;
  pointer_____offset_0x10___ *ppuVar16;
  randomx_flags rVar17;
  undefined8 unaff_RBP;
  undefined8 uVar18;
  char *pcVar19;
  int i;
  ulong uVar20;
  undefined **ppuVar21;
  undefined4 uVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int noncesCount;
  uint32_t count;
  uint local_12c;
  randomx_flags local_128;
  int local_124;
  randomx_vm *vm;
  double local_118;
  double dStack_110;
  long local_108;
  randomx_cache *cache;
  vector<randomx_vm_*,_std::allocator<randomx_vm_*>_> vms;
  char local_d8;
  uint64_t local_d0;
  int cpuid;
  atomic<unsigned_int> atomicNonce;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  uint32_t startItem;
  undefined4 uStack_9c;
  randomx_dataset *dataset;
  undefined8 local_90;
  reference_wrapper<std::atomic<unsigned_int>_> local_88;
  undefined4 local_80;
  char seed [4];
  long local_78;
  MineFunc *func;
  size_type local_68;
  undefined1 local_60 [16];
  AtomicHash result;
  
  dVar9 = (double)(ulong)(uint)argc;
  if (argc < 1) {
    local_78 = 0;
    unaff_RBP = 0;
    local_108 = 0;
LAB_001084e7:
    local_90 = 0;
    noncesCount = 1000;
    local_12c = 1;
    local_d0 = 0;
    local_124 = 1;
  }
  else {
    lVar23 = (long)dVar9 - 1;
    lVar4 = 0;
    local_118 = dVar9;
    do {
      iVar1 = strcmp(argv[lVar4],"--softAes");
      in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),iVar1 == 0);
      if (iVar1 == 0) break;
      bVar25 = lVar23 != lVar4;
      lVar4 = lVar4 + 1;
    } while (bVar25);
    lVar4 = in_RCX;
    lVar24 = 0;
    do {
      iVar1 = strcmp(argv[lVar24],"--mine");
      unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),iVar1 == 0);
      if (iVar1 == 0) break;
      bVar25 = lVar23 != lVar24;
      lVar24 = lVar24 + 1;
    } while (bVar25);
    lVar24 = 0;
    do {
      iVar1 = strcmp(argv[lVar24],"--verify");
      lVar4 = CONCAT71((int7)((ulong)lVar4 >> 8),iVar1 == 0);
      if (iVar1 == 0) break;
      bVar25 = lVar23 != lVar24;
      lVar24 = lVar24 + 1;
    } while (bVar25);
    local_108 = lVar4;
    dVar9 = local_118;
    local_78 = in_RCX;
    if (argc == 1) goto LAB_001084e7;
    uVar15 = (ulong)(argc - 1);
    uVar20 = 0;
    do {
      iVar1 = strcmp(argv[uVar20],"--threads");
      if ((iVar1 == 0) && (local_124 = atoi(argv[uVar20 + 1]), 0 < local_124)) goto LAB_00108554;
      uVar20 = uVar20 + 1;
    } while (uVar15 != uVar20);
    local_124 = 1;
LAB_00108554:
    uVar20 = 0;
    do {
      iVar1 = strcmp(argv[uVar20],"--affinity");
      if ((iVar1 == 0) && (local_d0 = strtoull(argv[uVar20 + 1],(char **)0x0,0), local_d0 != 0))
      goto LAB_00108599;
      uVar20 = uVar20 + 1;
    } while (uVar15 != uVar20);
    local_d0 = 0;
LAB_00108599:
    uVar20 = 0;
    do {
      iVar1 = strcmp(argv[uVar20],"--nonces");
      if ((iVar1 == 0) && (noncesCount = atoi(argv[uVar20 + 1]), 0 < noncesCount))
      goto LAB_001085d5;
      uVar20 = uVar20 + 1;
    } while (uVar15 != uVar20);
    noncesCount = 1000;
LAB_001085d5:
    uVar20 = 0;
    do {
      iVar1 = strcmp(argv[uVar20],"--init");
      if ((iVar1 == 0) && (local_12c = atoi(argv[uVar20 + 1]), 0 < (int)local_12c))
      goto LAB_00108613;
      uVar20 = uVar20 + 1;
    } while (uVar15 != uVar20);
    local_12c = 1;
LAB_00108613:
    uVar20 = 0;
    do {
      iVar1 = strcmp(argv[uVar20],"--seed");
      if (iVar1 == 0) {
        iVar1 = atoi(argv[uVar20 + 1]);
        local_90 = CONCAT44(extraout_var,iVar1);
        dVar9 = local_118;
        if (0 < iVar1) goto LAB_0010864f;
      }
      uVar20 = uVar20 + 1;
    } while (uVar15 != uVar20);
    local_90 = 0;
    dVar9 = local_118;
  }
LAB_0010864f:
  if (argc < 1) {
    bVar25 = false;
    rVar17 = RANDOMX_FLAG_DEFAULT;
    uVar22 = 0;
    local_128 = RANDOMX_FLAG_DEFAULT;
    bVar26 = false;
    bVar27 = false;
    bVar28 = false;
    local_118 = (double)((ulong)local_118 & 0xffffffff00000000);
  }
  else {
    uVar20 = 0;
    lVar4 = local_108;
    uVar18 = unaff_RBP;
    do {
      iVar1 = strcmp(argv[uVar20],"--largePages");
      uVar18 = CONCAT71((int7)((ulong)uVar18 >> 8),1);
      rVar17 = (randomx_flags)uVar18;
      if (iVar1 == 0) goto LAB_001086b3;
      uVar20 = uVar20 + 1;
    } while (dVar9 != (double)uVar20);
    uVar20 = 0;
    do {
      iVar1 = strcmp(argv[uVar20],"--largepages");
      if (iVar1 == 0) goto LAB_001086b3;
      uVar20 = uVar20 + 1;
    } while (dVar9 != (double)uVar20);
    rVar17 = RANDOMX_FLAG_DEFAULT;
LAB_001086b3:
    lVar24 = (long)dVar9 - 1;
    lVar23 = 0;
    do {
      iVar1 = strcmp(argv[lVar23],"--jit");
      bVar26 = iVar1 == 0;
      lVar4 = CONCAT71((int7)((ulong)lVar4 >> 8),bVar26);
      if (bVar26) break;
      bVar25 = lVar24 != lVar23;
      lVar23 = lVar23 + 1;
    } while (bVar25);
    lVar23 = 0;
    do {
      iVar1 = strcmp(argv[lVar23],"--help");
      lVar4 = CONCAT71((int7)((ulong)lVar4 >> 8),iVar1 == 0);
      if (iVar1 == 0) break;
      bVar25 = lVar24 != lVar23;
      lVar23 = lVar23 + 1;
    } while (bVar25);
    local_80 = (undefined4)lVar4;
    lVar4 = 0;
    local_128 = rVar17;
    do {
      iVar1 = strcmp(argv[lVar4],"--secure");
      bVar27 = iVar1 == 0;
      if (bVar27) break;
      bVar25 = lVar24 != lVar4;
      lVar4 = lVar4 + 1;
    } while (bVar25);
    lVar4 = 0;
    do {
      iVar1 = strcmp(argv[lVar4],"--ssse3");
      if (iVar1 == 0) break;
      bVar25 = lVar24 != lVar4;
      lVar4 = lVar4 + 1;
    } while (bVar25);
    lVar4 = 0;
    do {
      iVar2 = strcmp(argv[lVar4],"--avx2");
      bVar28 = iVar2 == 0;
      if (bVar28) break;
      bVar25 = lVar24 != lVar4;
      lVar4 = lVar4 + 1;
    } while (bVar25);
    lVar4 = 0;
    do {
      iVar2 = strcmp(argv[lVar4],"--auto");
      bVar25 = iVar2 == 0;
      if (bVar25) break;
      bVar29 = lVar24 != lVar4;
      lVar4 = lVar4 + 1;
    } while (bVar29);
    lVar4 = 0;
    do {
      iVar2 = strcmp(argv[lVar4],"--noBatch");
      local_118 = (double)CONCAT44(local_118._4_4_,CONCAT31((int3)((uint)iVar2 >> 8),iVar2 == 0));
      if (iVar2 == 0) break;
      bVar29 = lVar24 != lVar4;
      lVar4 = lVar4 + 1;
    } while (bVar29);
    rVar17 = (uint)(iVar1 == 0) << 5;
    uVar22 = local_80;
  }
  seed = SUB84(local_90,0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"RandomX benchmark v1.1.11",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  iVar1 = local_124;
  if ((char)uVar22 != '\0') {
    printUsage(*argv);
    return 0;
  }
  local_d8 = (char)unaff_RBP;
  if ((char)local_108 == '\0' && local_d8 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Please select either the fast mode (--mine) or the slow mode (--verify)",0x47);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Run \'",5);
    pcVar13 = *argv;
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x123138);
    }
    else {
      sVar5 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," --help\' to see all supported options",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    return 0;
  }
  atomicNonce.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0;
  lVar4 = 0;
  do {
    LOCK();
    result.hash[lVar4].super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar25) {
    local_12c = std::thread::hardware_concurrency();
    rVar3 = randomx_get_flags();
  }
  else {
    rVar3 = rVar17 + RANDOMX_FLAG_ARGON2_AVX2;
    if (!bVar28) {
      rVar3 = rVar17;
    }
    rVar17 = rVar3 | RANDOMX_FLAG_HARD_AES;
    if ((char)local_78 != '\0') {
      rVar17 = rVar3;
    }
    rVar3 = rVar17 | RANDOMX_FLAG_JIT;
    if (!bVar26) {
      rVar3 = rVar17;
    }
  }
  rVar3 = local_128 & 0xff | rVar3;
  rVar17 = rVar3 | RANDOMX_FLAG_FULL_MEM;
  if (local_d8 == '\0') {
    rVar17 = rVar3;
  }
  rVar3 = rVar17 | RANDOMX_FLAG_SECURE;
  if (!bVar27) {
    rVar3 = rVar17;
  }
  uVar20 = (ulong)rVar3;
  bVar25 = (rVar3 & RANDOMX_FLAG_ARGON2_SSSE3) == RANDOMX_FLAG_DEFAULT;
  pcVar13 = " - Argon2 implementation: SSSE3";
  if (bVar25) {
    pcVar13 = " - Argon2 implementation: reference";
  }
  bVar28 = (rVar3 & RANDOMX_FLAG_ARGON2_AVX2) == RANDOMX_FLAG_DEFAULT;
  pcVar19 = " - Argon2 implementation: AVX2";
  if (bVar28) {
    pcVar19 = pcVar13;
  }
  lVar4 = 0x1e;
  if (bVar28) {
    lVar4 = (ulong)bVar25 * 4 + 0x1f;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar19,lVar4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  pcVar13 = " - full memory mode (2080 MiB)";
  if ((rVar3 & RANDOMX_FLAG_FULL_MEM) == RANDOMX_FLAG_DEFAULT) {
    pcVar13 = " - light memory mode (256 MiB)";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  if ((rVar3 & RANDOMX_FLAG_JIT) == RANDOMX_FLAG_DEFAULT) {
    lVar4 = 0x13;
    pcVar13 = " - interpreted mode";
LAB_00108ad7:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,lVar4);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," - JIT compiled mode ",0x15);
    if ((rVar3 & RANDOMX_FLAG_SECURE) != RANDOMX_FLAG_DEFAULT) {
      lVar4 = 8;
      pcVar13 = "(secure)";
      goto LAB_00108ad7;
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  pcVar13 = " - hardware AES mode";
  if ((rVar3 & RANDOMX_FLAG_HARD_AES) == RANDOMX_FLAG_DEFAULT) {
    pcVar13 = " - software AES mode";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  pcVar13 = " - large pages mode";
  if ((rVar3 & RANDOMX_FLAG_LARGE_PAGES) == RANDOMX_FLAG_DEFAULT) {
    pcVar13 = " - small pages mode";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  if (local_d0 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," - thread affinity (",0x14);
    mask_to_string_abi_cxx11_((string *)&func,local_d0);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)func,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (func != (MineFunc *)local_60) {
      operator_delete(func);
    }
  }
  if (local_118._0_1_ == '\0') {
    func = mine<true>;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," - batch mode",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
  }
  else {
    func = mine<false>;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Initializing",0xc);
  if (local_d8 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_12c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," thread",7);
    pcVar13 = ")";
    if (1 < (int)local_12c) {
      pcVar13 = "s)";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,pcVar13,(ulong)(1 < (int)local_12c) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ...",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  if ((rVar3 & RANDOMX_FLAG_ARGON2_AVX2) == RANDOMX_FLAG_DEFAULT) {
    if ((rVar3 & RANDOMX_FLAG_ARGON2_SSSE3) != RANDOMX_FLAG_DEFAULT) {
      prVar7 = randomx_argon2_impl_ssse3();
      goto LAB_00108da7;
    }
  }
  else {
    prVar7 = randomx_argon2_impl_avx2();
LAB_00108da7:
    if (prVar7 == (randomx_argon2_impl *)0x0) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"Unsupported Argon2 implementation");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if ((rVar3 & RANDOMX_FLAG_JIT) == RANDOMX_FLAG_DEFAULT) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "WARNING: You are using the interpreter mode. Use --jit for optimal performance.",
               0x4f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
  }
  lVar4 = std::chrono::_V2::system_clock::now();
  cache = randomx_alloc_cache(rVar3);
  if (cache == (randomx_cache *)0x0) {
    ppuVar16 = &CacheAllocException::typeinfo;
    ppuVar21 = &PTR__exception_0011fef0;
LAB_00109646:
    puVar11 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar11 = ppuVar21;
    __cxa_throw(puVar11,ppuVar16,std::exception::~exception);
  }
  randomx_init_cache(cache,seed,4);
  if (local_d8 != '\0') {
    dataset = randomx_alloc_dataset(rVar3);
    if (dataset == (randomx_dataset *)0x0) {
      ppuVar16 = &DatasetAllocException::typeinfo;
      ppuVar21 = &PTR__exception_0011ff18;
      dataset = (randomx_dataset *)0x0;
      goto LAB_00109646;
    }
    uVar8 = randomx_dataset_item_count();
    if ((int)local_12c < 2) {
      randomx_init_dataset(dataset,cache,0,uVar8 & 0xffffffff);
    }
    else {
      local_118 = (double)CONCAT44(local_118._4_4_,rVar3);
      uVar20 = (ulong)local_12c;
      _startItem = (AtomicHash *)((ulong)_startItem & 0xffffffff00000000);
      uVar12 = local_12c;
      local_108 = lVar4;
      do {
        iVar1 = 0;
        if (uVar12 == 1) {
          iVar1 = (int)((uVar8 & 0xffffffff) % uVar20);
        }
        count = iVar1 + (int)((uVar8 & 0xffffffff) / uVar20);
        local_88._M_data = (atomic<unsigned_int> *)randomx_init_dataset;
        std::thread::
        thread<void(*)(randomx_dataset*,randomx_cache*,unsigned_long,unsigned_long),randomx_dataset*&,randomx_cache*&,unsigned_int&,unsigned_int&,void>
                  ((thread *)&vm,
                   (_func_void_randomx_dataset_ptr_randomx_cache_ptr_unsigned_long_unsigned_long **)
                   &local_88,&dataset,&cache,&startItem,&count);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  (&threads,(thread *)&vm);
        iVar1 = local_124;
        if (vm != (randomx_vm *)0x0) {
          std::terminate();
        }
        startItem = startItem + count;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      uVar20 = (ulong)local_118 & 0xffffffff;
      lVar4 = local_108;
      if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar15 = 1;
        do {
          std::thread::join();
          bVar25 = uVar15 < (ulong)((long)threads.
                                          super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)threads.
                                          super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar15 = (ulong)((int)uVar15 + 1);
          lVar4 = local_108;
        } while (bVar25);
      }
    }
    randomx_release_cache(cache);
    cache = (randomx_cache *)0x0;
    ptVar14 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        if ((ptVar14->_M_id)._M_thread != 0) {
          std::terminate();
        }
        ptVar14 = ptVar14 + 1;
      } while (ptVar14 !=
               threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish =
           threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Memory initialized in ",0x16);
  lVar23 = std::chrono::_V2::system_clock::now();
  lVar23 = lVar23 - lVar4;
  auVar31._8_4_ = (int)((ulong)lVar23 >> 0x20);
  auVar31._0_8_ = lVar23;
  auVar31._12_4_ = 0x45300000;
  poVar6 = std::ostream::_M_insert<double>
                     (((auVar31._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar23) - 4503599627370496.0)) /
                      1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," s",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Initializing ",0xd);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," virtual machine(s) ...",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  iVar2 = 1;
  if (1 < iVar1) {
    iVar2 = iVar1;
  }
  do {
    vm = randomx_create_vm((randomx_flags)uVar20,cache,dataset);
    if (vm == (randomx_vm *)0x0) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      if ((uVar20 & 2) == 0) {
        if ((undefined1)local_128 == '\0') {
          std::runtime_error::runtime_error(prVar10,"Cannot create VM");
        }
        else {
          std::runtime_error::runtime_error
                    (prVar10,"Cannot create VM with the selected options. Try without --largePages")
          ;
        }
      }
      else {
        std::runtime_error::runtime_error
                  (prVar10,"Cannot create VM with the selected options. Try using --softAes");
      }
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<randomx_vm*,std::allocator<randomx_vm*>>::_M_realloc_insert<randomx_vm*const&>
                ((vector<randomx_vm*,std::allocator<randomx_vm*>> *)&vms,
                 (iterator)
                 vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,&vm);
    }
    else {
      *vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
       super__Vector_impl_data._M_finish = vm;
      vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running benchmark (",0x13);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,noncesCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," nonces) ...",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  dVar9 = (double)std::chrono::_V2::system_clock::now();
  if (iVar1 < 2) {
    (*func)(*vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
             super__Vector_impl_data._M_start,&atomicNonce,&result,noncesCount,0,-1);
  }
  else {
    count = 0;
    local_118 = dVar9;
    if (vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar20 = 0;
      do {
        cpuid = -1;
        uVar12 = (uint)uVar20;
        if (local_d0 != 0) {
          cpuid = cpuid_from_mask(local_d0,&count);
          uVar12 = count;
        }
        local_88._M_data = &atomicNonce;
        _startItem = &result;
        std::thread::
        thread<void(*&)(randomx_vm*,std::atomic<unsigned_int>&,AtomicHash&,unsigned_int,int,int),randomx_vm*&,std::reference_wrapper<std::atomic<unsigned_int>>,std::reference_wrapper<AtomicHash>,int&,unsigned_int&,int&,void>
                  ((thread *)&vm,
                   (_func_void_randomx_vm_ptr_atomic<unsigned_int>_ptr_AtomicHash_ptr_uint_int_int
                    **)&func,
                   vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar12,&local_88,
                   (reference_wrapper<AtomicHash> *)&startItem,&noncesCount,&count,&cpuid);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  (&threads,(thread *)&vm);
        if (vm != (randomx_vm *)0x0) {
          std::terminate();
        }
        count = count + 1;
        uVar20 = (ulong)count;
      } while (uVar20 < (ulong)((long)vms.
                                      super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)vms.
                                      super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    dVar9 = local_118;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar20 = 1;
      do {
        std::thread::join();
        bVar25 = uVar20 < (ulong)((long)threads.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)threads.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar20 = (ulong)((int)uVar20 + 1);
      } while (bVar25);
    }
  }
  lVar4 = std::chrono::_V2::system_clock::now();
  if (vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar20 = 0;
    uVar15 = 1;
    do {
      randomx_destroy_vm(vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar20]);
      bVar25 = uVar15 < (ulong)((long)vms.
                                      super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)vms.
                                      super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar20 = uVar15;
      uVar15 = (ulong)((int)uVar15 + 1);
    } while (bVar25);
  }
  if (local_d8 == '\0') {
    randomx_release_cache(cache);
    iVar1 = (int)local_90;
  }
  else {
    randomx_release_dataset(dataset);
    iVar1 = (int)local_90;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Calculated result: ",0x13);
  AtomicHash::print(&result,(ostream *)&std::cout);
  if ((iVar1 == 0) && (noncesCount == 1000)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Reference result:  10b649a3f15c7c7f88277812f2e74b337a0f20ce909af09199cccb960771cfa1"
               ,0x53);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
  }
  lVar4 = lVar4 - (long)dVar9;
  auVar30._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar30._0_8_ = lVar4;
  auVar30._12_4_ = 0x45300000;
  dStack_110 = auVar30._8_8_ - 1.9342813113834067e+25;
  local_118 = (dStack_110 + ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) /
              1000000000.0;
  if (local_d8 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Performance: ",0xd);
    poVar6 = std::ostream::_M_insert<double>((local_118 * 1000.0) / (double)noncesCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ms per hash",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Performance: ",0xd);
    poVar6 = std::ostream::_M_insert<double>((double)noncesCount / local_118);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," hashes per second",0x12);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  }
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  if (vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	bool softAes, miningMode, verificationMode, help, largePages, jit, secure;
	bool ssse3, avx2, autoFlags, noBatch;
	int noncesCount, threadCount, initThreadCount;
	uint64_t threadAffinity;
	int32_t seedValue;
	char seed[4];

	readOption("--softAes", argc, argv, softAes);
	readOption("--mine", argc, argv, miningMode);
	readOption("--verify", argc, argv, verificationMode);
	readIntOption("--threads", argc, argv, threadCount, 1);
	readUInt64Option("--affinity", argc, argv, threadAffinity, 0);
	readIntOption("--nonces", argc, argv, noncesCount, 1000);
	readIntOption("--init", argc, argv, initThreadCount, 1);
	readIntOption("--seed", argc, argv, seedValue, 0);
	readOption("--largePages", argc, argv, largePages);
	if (!largePages) {
		readOption("--largepages", argc, argv, largePages);
	}
	readOption("--jit", argc, argv, jit);
	readOption("--help", argc, argv, help);
	readOption("--secure", argc, argv, secure);
	readOption("--ssse3", argc, argv, ssse3);
	readOption("--avx2", argc, argv, avx2);
	readOption("--auto", argc, argv, autoFlags);
	readOption("--noBatch", argc, argv, noBatch);

	store32(&seed, seedValue);

	std::cout << "RandomX benchmark v1.1.11" << std::endl;

	if (help) {
		printUsage(argv[0]);
		return 0;
	}

	if (!miningMode && !verificationMode) {
		std::cout << "Please select either the fast mode (--mine) or the slow mode (--verify)" << std::endl;
		std::cout << "Run '" << argv[0] << " --help' to see all supported options" << std::endl;
		return 0;
	}

	std::atomic<uint32_t> atomicNonce(0);
	AtomicHash result;
	std::vector<randomx_vm*> vms;
	std::vector<std::thread> threads;
	randomx_dataset* dataset;
	randomx_cache* cache;
	randomx_flags flags;

	if (autoFlags) {
		initThreadCount = std::thread::hardware_concurrency();
		flags = randomx_get_flags();
	}
	else {
		flags = RANDOMX_FLAG_DEFAULT;
		if (ssse3) {
			flags |= RANDOMX_FLAG_ARGON2_SSSE3;
		}
		if (avx2) {
			flags |= RANDOMX_FLAG_ARGON2_AVX2;
		}
		if (!softAes) {
			flags |= RANDOMX_FLAG_HARD_AES;
		}
		if (jit) {
			flags |= RANDOMX_FLAG_JIT;
#ifdef RANDOMX_FORCE_SECURE
			flags |= RANDOMX_FLAG_SECURE;
#endif
		}
	}

	if (largePages) {
		flags |= RANDOMX_FLAG_LARGE_PAGES;
	}
	if (miningMode) {
		flags |= RANDOMX_FLAG_FULL_MEM;
	}
#ifndef RANDOMX_FORCE_SECURE
	if (secure) {
		flags |= RANDOMX_FLAG_SECURE;
	}
#endif

	if (flags & RANDOMX_FLAG_ARGON2_AVX2) {
		std::cout << " - Argon2 implementation: AVX2" << std::endl;
	}
	else if (flags & RANDOMX_FLAG_ARGON2_SSSE3) {
		std::cout << " - Argon2 implementation: SSSE3" << std::endl;
	}
	else {
		std::cout << " - Argon2 implementation: reference" << std::endl;
	}

	if (flags & RANDOMX_FLAG_FULL_MEM) {
		std::cout << " - full memory mode (2080 MiB)" << std::endl;
	}
	else {
		std::cout << " - light memory mode (256 MiB)" << std::endl;
	}

	if (flags & RANDOMX_FLAG_JIT) {
		std::cout << " - JIT compiled mode ";
		if (flags & RANDOMX_FLAG_SECURE) {
			std::cout << "(secure)";
		}
		std::cout << std::endl;
	}
	else {
		std::cout << " - interpreted mode" << std::endl;
	}

	if (flags & RANDOMX_FLAG_HARD_AES) {
		std::cout << " - hardware AES mode" << std::endl;
	}
	else {
		std::cout << " - software AES mode" << std::endl;
	}

	if (flags & RANDOMX_FLAG_LARGE_PAGES) {
		std::cout << " - large pages mode" << std::endl;
	}
	else {
		std::cout << " - small pages mode" << std::endl;
	}

	if (threadAffinity) {
		std::cout << " - thread affinity (" << mask_to_string(threadAffinity) << ")" << std::endl;
	}

	MineFunc* func;

	if (noBatch) {
		func = &mine<false>;
	}
	else {
		func = &mine<true>;
		std::cout << " - batch mode" << std::endl;
	}

	std::cout << "Initializing";
	if (miningMode)
		std::cout << " (" << initThreadCount << " thread" << (initThreadCount > 1 ? "s)" : ")");
	std::cout << " ..." << std::endl;

	try {
		if (nullptr == randomx::selectArgonImpl(flags)) {
			throw std::runtime_error("Unsupported Argon2 implementation");
		}
		if ((flags & RANDOMX_FLAG_JIT) && !RANDOMX_HAVE_COMPILER) {
			throw std::runtime_error("JIT compilation is not supported on this platform. Try without --jit");
		}
		if (!(flags & RANDOMX_FLAG_JIT) && RANDOMX_HAVE_COMPILER) {
			std::cout << "WARNING: You are using the interpreter mode. Use --jit for optimal performance." << std::endl;
		}

		Stopwatch sw(true);
		cache = randomx_alloc_cache(flags);
		if (cache == nullptr) {
			throw CacheAllocException();
		}
		randomx_init_cache(cache, &seed, sizeof(seed));
		if (miningMode) {
			dataset = randomx_alloc_dataset(flags);
			if (dataset == nullptr) {
				throw DatasetAllocException();
			}
			uint32_t datasetItemCount = randomx_dataset_item_count();
			if (initThreadCount > 1) {
				auto perThread = datasetItemCount / initThreadCount;
				auto remainder = datasetItemCount % initThreadCount;
				uint32_t startItem = 0;
				for (int i = 0; i < initThreadCount; ++i) {
					auto count = perThread + (i == initThreadCount - 1 ? remainder : 0);
					threads.push_back(std::thread(&randomx_init_dataset, dataset, cache, startItem, count));
					startItem += count;
				}
				for (unsigned i = 0; i < threads.size(); ++i) {
					threads[i].join();
				}
			}
			else {
				randomx_init_dataset(dataset, cache, 0, datasetItemCount);
			}
			randomx_release_cache(cache);
			cache = nullptr;
			threads.clear();
		}
		std::cout << "Memory initialized in " << sw.getElapsed() << " s" << std::endl;
		std::cout << "Initializing " << threadCount << " virtual machine(s) ..." << std::endl;
		for (int i = 0; i < threadCount; ++i) {
			randomx_vm *vm = randomx_create_vm(flags, cache, dataset);
			if (vm == nullptr) {
				if ((flags & RANDOMX_FLAG_HARD_AES)) {
					throw std::runtime_error("Cannot create VM with the selected options. Try using --softAes");
				}
				if (largePages) {
					throw std::runtime_error("Cannot create VM with the selected options. Try without --largePages");
				}
				throw std::runtime_error("Cannot create VM");
			}
			vms.push_back(vm);
		}
		std::cout << "Running benchmark (" << noncesCount << " nonces) ..." << std::endl;
		sw.restart();
		if (threadCount > 1) {
			for (unsigned i = 0; i < vms.size(); ++i) {
				int cpuid = -1;
				if (threadAffinity)
					cpuid = cpuid_from_mask(threadAffinity, i);
				threads.push_back(std::thread(func, vms[i], std::ref(atomicNonce), std::ref(result), noncesCount, i, cpuid));
			}
			for (unsigned i = 0; i < threads.size(); ++i) {
				threads[i].join();
			}
		}
		else {
			func(vms[0], std::ref(atomicNonce), std::ref(result), noncesCount, 0, -1);
		}

		double elapsed = sw.getElapsed();
		for (unsigned i = 0; i < vms.size(); ++i)
			randomx_destroy_vm(vms[i]);
		if (miningMode)
			randomx_release_dataset(dataset);
		else
			randomx_release_cache(cache);
		std::cout << "Calculated result: ";
		result.print(std::cout);
		if (noncesCount == 1000 && seedValue == 0)
			std::cout << "Reference result:  10b649a3f15c7c7f88277812f2e74b337a0f20ce909af09199cccb960771cfa1" << std::endl;
		if (!miningMode) {
			std::cout << "Performance: " << 1000 * elapsed / noncesCount << " ms per hash" << std::endl;
		}
		else {
			std::cout << "Performance: " << noncesCount / elapsed << " hashes per second" << std::endl;
		}
	}
	catch (MemoryException& e) {
		std::cout << "ERROR: " << e.what() << std::endl;
		if (largePages) {
#ifdef _WIN32
			std::cout << "To use large pages, please enable the \"Lock Pages in Memory\" policy and reboot." << std::endl;
			if (!IsWindows8OrGreater()) {
				std::cout << "Additionally, you have to run the benchmark from elevated command prompt." << std::endl;
			}
#else
			std::cout << "To use large pages, please run: sudo sysctl -w vm.nr_hugepages=1250" << std::endl;
#endif
		}
		return 1;
	}
	catch (std::exception& e) {
		std::cout << "ERROR: " << e.what() << std::endl;
		return 1;
	}
	return 0;
}